

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

TRef lj_record_idx(jit_State *J,RecordIndex *ix)

{
  int *piVar1;
  cTValue *ptr;
  char cVar2;
  uint uVar3;
  double dVar4;
  IRIns *pIVar5;
  TRef *pTVar6;
  TValue *pTVar7;
  IRRef1 IVar8;
  TRef TVar9;
  TRef TVar10;
  int iVar11;
  BCReg func;
  cTValue *pcVar12;
  cTValue *pcVar13;
  uint uVar14;
  long lVar15;
  uint8_t uVar16;
  ptrdiff_t nargs;
  ushort uVar17;
  uint uVar18;
  uint ref;
  code *cont;
  IRRef1 IVar19;
  bool bVar20;
  uint uVar21;
  GCtab *pGVar22;
  
  pTVar7 = &ix->keyv;
  ptr = (cTValue *)(J[-1].penalty + 0x34);
  uVar18 = ix->tab;
  do {
    if ((uVar18 & 0x1f000000) == 0xb000000) {
      dVar4 = pTVar7->n;
      if ((dVar4 == -NAN) || (((ushort)((ulong)dVar4 >> 0x30) < 0xfff9 && (NAN(dVar4))))) {
        if (ix->val != 0) {
          lj_trace_err(J,LJ_TRERR_STORENN);
        }
        if ((ix->key & 0x8000) != 0) goto LAB_0012ebe4;
      }
      else {
LAB_0012ebe4:
        pGVar22 = (GCtab *)((ix->tabv).u64 & 0x7fffffffffff);
        pcVar12 = lj_tab_get(J->L,pGVar22,pTVar7);
        ix->oldv = pcVar12;
        uVar18 = ix->key;
        if ((uVar18 >> 0x18 & 0x1e) - 0xe < 6) {
          dVar4 = pTVar7->n;
          uVar14 = (int)dVar4;
          if ((double)(int)dVar4 != dVar4) {
            uVar14 = 0x8000001;
          }
          if (NAN((double)(int)dVar4) || NAN(dVar4)) {
            uVar14 = 0x8000001;
          }
          if (0x8000000 < uVar14) {
            if ((short)uVar18 < 0) {
              if (pGVar22->asize != 0) {
                lj_trace_err(J,LJ_TRERR_NYITMIX);
              }
              (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
              *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4513000a;
              TVar9 = lj_opt_fold(J);
              TVar10 = lj_ir_kint(J,0);
              (J->fold).ins.field_0.ot = 0x893;
              (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
              lj_opt_fold(J);
            }
            goto LAB_0012ed8e;
          }
          TVar9 = lj_opt_narrow_index(J,uVar18);
          (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4513000a;
          TVar10 = lj_opt_fold(J);
          if (pGVar22->asize <= uVar14) {
            (J->fold).ins.field_0.ot = 0x693;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar10;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
            lj_opt_fold(J);
            if (uVar14 == 0 && (uVar18 & 0x8000) == 0) {
              uVar18 = lj_ir_knum_u64(J,0);
            }
            goto LAB_0012ed8e;
          }
          rec_idx_abc(J,TVar10,TVar9,pGVar22->asize);
          (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090008;
          TVar10 = lj_opt_fold(J);
          (J->fold).ins.field_0.ot = 0x3809;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar10;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
LAB_0012eee2:
          TVar9 = lj_opt_fold(J);
LAB_0012ef51:
          ref = 0;
          uVar16 = '\0';
        }
        else {
LAB_0012ed8e:
          if (pGVar22->hmask == 0) {
            (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4513000b;
            TVar9 = lj_opt_fold(J);
            TVar10 = lj_ir_kint(J,0);
            (J->fold).ins.field_0.ot = 0x893;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
            lj_opt_fold(J);
            TVar9 = lj_ir_kptr_(J,IR_KKPTR,ptr);
            goto LAB_0012ef51;
          }
          if ((uVar18 >> 0x18 & 0x1f) - 0xf < 5) {
            (J->fold).ins.field_0.op1 = (IRRef1)uVar18;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
            uVar18 = lj_opt_fold(J);
          }
          if (((((short)(IRRef1)uVar18 < 0) || (pGVar22->hmask == 0)) ||
              (uVar14 = *(int *)&ix->oldv - (int)(pGVar22->node).ptr64,
              pGVar22->hmask * 0x18 < uVar14)) || (0x17ffe8 < uVar14)) {
            TVar9 = ix->tab;
            (J->fold).ins.field_0.ot = 0x3a09;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
            (J->fold).ins.field_0.op2 = (IRRef1)uVar18;
            goto LAB_0012eee2;
          }
          ref = (J->cur).nins;
          uVar16 = (J->guardemit).irt;
          (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4513000b;
          TVar9 = lj_opt_fold(J);
          TVar10 = lj_ir_kint(J,pGVar22->hmask);
          (J->fold).ins.field_0.ot = 0x893;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
          lj_opt_fold(J);
          (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090009;
          TVar9 = lj_opt_fold(J);
          TVar10 = lj_ir_kslot(J,uVar18,uVar14 / 0x18);
          (J->fold).ins.field_0.ot = 0x3989;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
          TVar9 = lj_opt_fold(J);
        }
        IVar19 = (IRRef1)TVar9;
        pIVar5 = (J->cur).ir;
        uVar18 = TVar9 & 0xffff;
        cVar2 = *(char *)((long)pIVar5 + (ulong)uVar18 * 8 + 5);
        if (cVar2 == '\x1a') {
          pcVar12 = *(cTValue **)&pIVar5[(ulong)uVar18 + 1].i;
        }
        else {
          pcVar12 = ix->oldv;
        }
        uVar21 = cVar2 == '8' ^ 0x43;
        uVar14 = ix->val;
        if (uVar14 != 0) {
          pGVar22 = *(GCtab **)(((ix->tabv).u64 & 0x7fffffffffff) + 0x20);
          uVar3 = ix->key;
          if (uVar18 < ref) {
            lj_ir_rollback(J,ref);
            (J->guardemit).irt = uVar16;
          }
          if (pcVar12->u64 == 0xffffffffffffffff) {
            if (((ix->idxchain == 0) || (pGVar22 == (GCtab *)0x0)) ||
               ((pcVar13 = lj_tab_getstr(pGVar22,*(GCstr **)&J[-1].penalty[0x3f].val),
                pcVar13 == (cTValue *)0x0 || (pcVar13->u64 == 0xffffffffffffffff)))) {
              if (cVar2 == ':') {
                uVar17 = (ushort)(pcVar12 != ptr) << 8 | 0x889;
                TVar9 = lj_ir_kptr_(J,IR_KKPTR,ptr);
                IVar8 = (IRRef1)TVar9;
                goto LAB_0012f053;
              }
            }
            else {
              uVar17 = (ushort)(uVar21 << 8) | 0x80;
              IVar8 = 0;
LAB_0012f053:
              (J->fold).ins.field_0.ot = uVar17;
              (J->fold).ins.field_0.op1 = IVar19;
              (J->fold).ins.field_0.op2 = IVar8;
              lj_opt_fold(J);
            }
            if ((ix->idxchain != 0) && (iVar11 = lj_record_mm_lookup(J,ix,MM_newindex), iVar11 != 0)
               ) goto LAB_0012f179;
            if (pcVar12 == ptr) {
              uVar18 = ix->key;
              if ((uVar18 >> 0x18 & 0x1f) - 0xf < 5) {
                (J->fold).ins.field_0.op1 = (IRRef1)uVar18;
                *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
                uVar18 = lj_opt_fold(J);
              }
              TVar9 = ix->tab;
              (J->fold).ins.field_0.ot = 0x3b09;
              (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
              (J->fold).ins.field_0.op2 = (IRRef1)uVar18;
              TVar9 = lj_opt_fold(J);
              IVar19 = (IRRef1)TVar9;
              bVar20 = false;
            }
            else {
              bVar20 = (uVar14 & 0x1f000000) != 0 && (uVar3 >> 0x18 & 0x1f) - 4 < 9;
            }
          }
          else {
            iVar11 = lj_opt_fwd_wasnonnil(J,(IROpT)uVar21,uVar18);
            if (iVar11 == 0) {
              if (cVar2 == ':') {
                TVar9 = lj_ir_kptr_(J,IR_KKPTR,ptr);
                (J->fold).ins.field_0.ot = 0x989;
                (J->fold).ins.field_0.op1 = IVar19;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
                lj_opt_fold(J);
              }
              bVar20 = (uVar14 & 0x1f000000) != 0 && (uVar3 >> 0x18 & 0x1f) - 4 < 9;
              if (ix->idxchain != 0) {
                if (pGVar22 == (GCtab *)0x0) {
                  (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
                  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x450b0007;
                  TVar9 = lj_opt_fold(J);
                  TVar10 = lj_ir_knull(J,IRT_TAB);
                  (J->fold).ins.field_0.ot = 0x88b;
                  (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
                  (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
                }
                else {
                  uVar17 = 0x8e;
                  if (0xfffffffffffffff1 < (ulong)(pcVar12->it64 >> 0x2f)) {
                    uVar17 = ~(ushort)(int)(pcVar12->it64 >> 0x2f) | 0x80;
                  }
                  (J->fold).ins.field_0.ot = uVar17 + (short)(uVar21 << 8);
                  (J->fold).ins.field_0.op1 = IVar19;
                  (J->fold).ins.field_0.op2 = 0;
                }
                lj_opt_fold(J);
              }
            }
            else {
              bVar20 = false;
            }
          }
          uVar18 = ix->val;
          uVar14 = uVar18 >> 0x18 & 0x1f;
          if (uVar14 - 0xf < 5) {
            (J->fold).ins.field_0.op1 = (IRRef1)uVar18;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
            uVar18 = lj_opt_fold(J);
            ix->val = uVar18;
            uVar14 = uVar18 >> 0x18 & 0x1f;
          }
          (J->fold).ins.field_0.ot = (ushort)(uVar21 << 8) | (ushort)uVar14 | 0x800;
          (J->fold).ins.field_0.op1 = IVar19;
          (J->fold).ins.field_0.op2 = (IRRef1)uVar18;
          lj_opt_fold(J);
          if ((bVar20) || ((*(byte *)((long)&ix->val + 3) & 0x1f) - 4 < 9)) {
            (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x58000000;
            lj_opt_fold(J);
          }
          uVar18 = ix->key;
          if ((uVar18 & 0x1f000000) != 0x4000000) goto LAB_0012f5e2;
          if ((short)uVar18 < 0) break;
          lVar15 = 0;
          goto LAB_0012f584;
        }
        uVar18 = ~(uint)(pcVar12->it64 >> 0x2f);
        if ((ulong)(pcVar12->it64 >> 0x2f) < 0xfffffffffffffff2) {
          uVar18 = 0xe;
        }
        if (pcVar12 == ptr) {
          TVar9 = lj_ir_kptr_(J,IR_KKPTR,ptr);
          (J->fold).ins.field_0.ot = 0x889;
          (J->fold).ins.field_0.op1 = IVar19;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
          lj_opt_fold(J);
          TVar9 = 0x7fff;
        }
        else {
          (J->fold).ins.field_0.ot = (short)uVar18 + (short)(uVar21 << 8) + 0x80;
          (J->fold).ins.field_0.op1 = IVar19;
          (J->fold).ins.field_0.op2 = 0;
          TVar9 = lj_opt_fold(J);
        }
        if ((TVar9 & 0xffff) < ref) {
          lj_ir_rollback(J,ref);
          (J->guardemit).irt = uVar16;
        }
        if (uVar18 != 0) {
          if (uVar18 < 3) {
            return uVar18 * 0x1000001 ^ 0x7fff;
          }
          return TVar9;
        }
      }
      if (ix->idxchain == 0) {
        return 0x7fff;
      }
      iVar11 = lj_record_mm_lookup(J,ix,MM_index);
      if (iVar11 == 0) {
        return 0x7fff;
      }
    }
    else {
      iVar11 = lj_record_mm_lookup(J,ix,(uint)(ix->val != 0));
      if (iVar11 == 0) {
        lj_trace_err(J,LJ_TRERR_NOMM);
      }
    }
LAB_0012f179:
    uVar18 = ix->mobj;
    if ((uVar18 & 0x1f000000) == 0x8000000) {
      cont = lj_cont_nop;
      if (ix->val == 0) {
        cont = lj_cont_ra;
      }
      func = rec_mm_prep(J,cont);
      pTVar6 = J->base;
      pTVar7 = J->L->base;
      pTVar6[func] = ix->mobj;
      pTVar6[(ulong)func + 2] = ix->tab;
      pTVar6[(ulong)func + 3] = ix->key;
      pTVar7[func].u64 = (ix->mobjv).u64 & 0x7fffffffffff | 0xfffb800000000000;
      pTVar7[(ulong)func + 2].gcr.gcptr64 = (uint64_t)ix->tabv;
      pTVar7[(ulong)func + 3] = ix->keyv;
      if (ix->val == 0) {
        nargs = 2;
      }
      else {
        pTVar6[(ulong)func + 4] = ix->val;
        pTVar7[(ulong)func + 4] = ix->valv;
        nargs = 3;
      }
      lj_record_call(J,func,nargs);
      return 0;
    }
    if (((((ix->mt == 0x7fff) && (ix->val == 0)) && ((ix->tab & 0x1f000000) == 0xc000000)) &&
        (((uVar18 & 0x1f000000) == 0xb000000 &&
         (*(char *)(((ix->tabv).u64 & 0x7fffffffffff) + 10) == '\x03')))) &&
       ((ix->key & 0x1f008000) == 0x4000000)) {
      pcVar12 = lj_tab_getstr((GCtab *)((ix->mobjv).u64 & 0x7fffffffffff),
                              (GCstr *)((ix->keyv).u64 & 0x7fffffffffff));
      TVar9 = lj_record_constify(J,pcVar12);
      if (TVar9 != 0) {
        return TVar9;
      }
      uVar18 = ix->mobj;
    }
    ix->tab = uVar18;
    ix->tabv = ix->mobjv;
    piVar1 = &ix->idxchain;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      lj_trace_err(J,LJ_TRERR_IDXLOOP);
    }
  } while( true );
LAB_0012f599:
  (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x3e09000c;
  TVar9 = lj_opt_fold(J);
  TVar10 = lj_ir_kint(J,0);
  (J->fold).ins.field_0.ot = 0x4d10;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
  lj_opt_fold(J);
  goto LAB_0012f5e2;
  while (lVar15 = lVar15 + 1, lVar15 != 6) {
LAB_0012f584:
    if (*(IRIns *)((long)J + lVar15 * 8 + -0x138) == (J->cur).ir[(ulong)(uVar18 & 0x7fff) + 1])
    goto LAB_0012f599;
  }
LAB_0012f5e2:
  J->needsnap = '\x01';
  return 0;
}

Assistant:

TRef lj_record_idx(jit_State *J, RecordIndex *ix)
{
  TRef xref;
  IROp xrefop, loadop;
  IRRef rbref;
  IRType1 rbguard;
  cTValue *oldv;

  while (!tref_istab(ix->tab)) { /* Handle non-table lookup. */
    /* Never call raw lj_record_idx() on non-table. */
    lj_assertJ(ix->idxchain != 0, "bad usage");
    if (!lj_record_mm_lookup(J, ix, ix->val ? MM_newindex : MM_index))
      lj_trace_err(J, LJ_TRERR_NOMM);
  handlemm:
    if (tref_isfunc(ix->mobj)) {  /* Handle metamethod call. */
      BCReg func = rec_mm_prep(J, ix->val ? lj_cont_nop : lj_cont_ra);
      TRef *base = J->base + func + LJ_FR2;
      TValue *tv = J->L->base + func + LJ_FR2;
      base[-LJ_FR2] = ix->mobj; base[1] = ix->tab; base[2] = ix->key;
      setfuncV(J->L, tv-LJ_FR2, funcV(&ix->mobjv));
      copyTV(J->L, tv+1, &ix->tabv);
      copyTV(J->L, tv+2, &ix->keyv);
      if (ix->val) {
	base[3] = ix->val;
	copyTV(J->L, tv+3, &ix->valv);
	lj_record_call(J, func, 3);  /* mobj(tab, key, val) */
	return 0;
      } else {
	lj_record_call(J, func, 2);  /* res = mobj(tab, key) */
	return 0;  /* No result yet. */
      }
    }
#if LJ_HASBUFFER
    /* The index table of buffer objects is treated as immutable. */
    if (ix->mt == TREF_NIL && !ix->val &&
	tref_isudata(ix->tab) && udataV(&ix->tabv)->udtype == UDTYPE_BUFFER &&
	tref_istab(ix->mobj) && tref_isstr(ix->key) && tref_isk(ix->key)) {
      cTValue *val = lj_tab_getstr(tabV(&ix->mobjv), strV(&ix->keyv));
      TRef tr = lj_record_constify(J, val);
      if (tr) return tr;  /* Specialize to the value, i.e. a method. */
    }
#endif
    /* Otherwise retry lookup with metaobject. */
    ix->tab = ix->mobj;
    copyTV(J->L, &ix->tabv, &ix->mobjv);
    if (--ix->idxchain == 0)
      lj_trace_err(J, LJ_TRERR_IDXLOOP);
  }

  /* First catch nil and NaN keys for tables. */
  if (tvisnil(&ix->keyv) || (tvisnum(&ix->keyv) && tvisnan(&ix->keyv))) {
    if (ix->val)  /* Better fail early. */
      lj_trace_err(J, LJ_TRERR_STORENN);
    if (tref_isk(ix->key)) {
      if (ix->idxchain && lj_record_mm_lookup(J, ix, MM_index))
	goto handlemm;
      return TREF_NIL;
    }
  }

  /* Record the key lookup. */
  xref = rec_idx_key(J, ix, &rbref, &rbguard);
  xrefop = IR(tref_ref(xref))->o;
  loadop = xrefop == IR_AREF ? IR_ALOAD : IR_HLOAD;
  /* The lj_meta_tset() inconsistency is gone, but better play safe. */
  oldv = xrefop == IR_KKPTR ? (cTValue *)ir_kptr(IR(tref_ref(xref))) : ix->oldv;

  if (ix->val == 0) {  /* Indexed load */
    IRType t = itype2irt(oldv);
    TRef res;
    if (oldv == niltvg(J2G(J))) {
      emitir(IRTG(IR_EQ, IRT_PGC), xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      res = TREF_NIL;
    } else {
      res = emitir(IRTG(loadop, t), xref, 0);
    }
    if (tref_ref(res) < rbref) {  /* HREFK + load forwarded? */
      lj_ir_rollback(J, rbref);  /* Rollback to eliminate hmask guard. */
      J->guardemit = rbguard;
    }
    if (t == IRT_NIL && ix->idxchain && lj_record_mm_lookup(J, ix, MM_index))
      goto handlemm;
    if (irtype_ispri(t)) res = TREF_PRI(t);  /* Canonicalize primitives. */
    return res;
  } else {  /* Indexed store. */
    GCtab *mt = tabref(tabV(&ix->tabv)->metatable);
    int keybarrier = tref_isgcv(ix->key) && !tref_isnil(ix->val);
    if (tref_ref(xref) < rbref) {  /* HREFK forwarded? */
      lj_ir_rollback(J, rbref);  /* Rollback to eliminate hmask guard. */
      J->guardemit = rbguard;
    }
    if (tvisnil(oldv)) {  /* Previous value was nil? */
      /* Need to duplicate the hasmm check for the early guards. */
      int hasmm = 0;
      if (ix->idxchain && mt) {
	cTValue *mo = lj_tab_getstr(mt, mmname_str(J2G(J), MM_newindex));
	hasmm = mo && !tvisnil(mo);
      }
      if (hasmm)
	emitir(IRTG(loadop, IRT_NIL), xref, 0);  /* Guard for nil value. */
      else if (xrefop == IR_HREF)
	emitir(IRTG(oldv == niltvg(J2G(J)) ? IR_EQ : IR_NE, IRT_PGC),
	       xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      if (ix->idxchain && lj_record_mm_lookup(J, ix, MM_newindex)) {
	lj_assertJ(hasmm, "inconsistent metamethod handling");
	goto handlemm;
      }
      lj_assertJ(!hasmm, "inconsistent metamethod handling");
      if (oldv == niltvg(J2G(J))) {  /* Need to insert a new key. */
	TRef key = ix->key;
	if (tref_isinteger(key))  /* NEWREF needs a TValue as a key. */
	  key = emitir(IRTN(IR_CONV), key, IRCONV_NUM_INT);
	xref = emitir(IRT(IR_NEWREF, IRT_PGC), ix->tab, key);
	keybarrier = 0;  /* NEWREF already takes care of the key barrier. */
#ifdef LUAJIT_ENABLE_TABLE_BUMP
	if ((J->flags & JIT_F_OPT_SINK))  /* Avoid a separate flag. */
	  rec_idx_bump(J, ix);
#endif
      }
    } else if (!lj_opt_fwd_wasnonnil(J, loadop, tref_ref(xref))) {
      /* Cannot derive that the previous value was non-nil, must do checks. */
      if (xrefop == IR_HREF)  /* Guard against store to niltv. */
	emitir(IRTG(IR_NE, IRT_PGC), xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      if (ix->idxchain) {  /* Metamethod lookup required? */
	/* A check for NULL metatable is cheaper (hoistable) than a load. */
	if (!mt) {
	  TRef mtref = emitir(IRT(IR_FLOAD, IRT_TAB), ix->tab, IRFL_TAB_META);
	  emitir(IRTG(IR_EQ, IRT_TAB), mtref, lj_ir_knull(J, IRT_TAB));
	} else {
	  IRType t = itype2irt(oldv);
	  emitir(IRTG(loadop, t), xref, 0);  /* Guard for non-nil value. */
	}
      }
    } else {
      keybarrier = 0;  /* Previous non-nil value kept the key alive. */
    }
    /* Convert int to number before storing. */
    if (!LJ_DUALNUM && tref_isinteger(ix->val))
      ix->val = emitir(IRTN(IR_CONV), ix->val, IRCONV_NUM_INT);
    emitir(IRT(loadop+IRDELTA_L2S, tref_type(ix->val)), xref, ix->val);
    if (keybarrier || tref_isgcv(ix->val))
      emitir(IRT(IR_TBAR, IRT_NIL), ix->tab, 0);
    /* Invalidate neg. metamethod cache for stores with certain string keys. */
    if (!nommstr(J, ix->key)) {
      TRef fref = emitir(IRT(IR_FREF, IRT_PGC), ix->tab, IRFL_TAB_NOMM);
      emitir(IRT(IR_FSTORE, IRT_U8), fref, lj_ir_kint(J, 0));
    }
    J->needsnap = 1;
    return 0;
  }
}